

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_query.cpp
# Opt level: O2

void __thiscall
create::SerialQuery::SerialQuery
          (SerialQuery *this,shared_ptr<create::Data> *d,bool install_signal_handler)

{
  __shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&d->super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>);
  Serial::Serial(&this->super_Serial,(shared_ptr<create::Data> *)&_Stack_28,install_signal_handler);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  (this->super_Serial)._vptr_Serial = (_func_int **)&PTR_startSensorStream_001692f0;
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->streamRecoveryTimer).impl_,&(this->super_Serial).io,(type *)0x0);
  this->packetID = '\a';
  this->packetByte = '\0';
  this->packetData = 0;
  this->maxPacketID = '\x1a';
  return;
}

Assistant:

SerialQuery::SerialQuery(std::shared_ptr<Data> d, bool install_signal_handler)
  : Serial(d, install_signal_handler),
    streamRecoveryTimer(io),
    packetID(ID_BUMP_WHEELDROP),
    packetByte(0),
    packetData(0),
    maxPacketID(ID_CAPACITY) {
  }